

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_d_generator.cc
# Opt level: O0

void __thiscall
t_d_generator::print_server_skeleton(t_d_generator *this,ostream *out,t_service *tservice)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  ostream *poVar4;
  t_program *ptVar5;
  vector<t_function_*,_std::allocator<t_function_*>_> *__x;
  reference pptVar6;
  string *name;
  string local_2e8;
  string local_2c8;
  string local_2a8;
  string local_288;
  string local_268;
  string local_248;
  string local_228;
  string local_208;
  string local_1e8;
  t_type *local_1c8;
  t_type *rt;
  string local_1a0;
  string local_180;
  string local_160;
  __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
  local_140;
  t_function **local_138;
  __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
  local_130;
  iterator f_iter;
  vector<t_function_*,_std::allocator<t_function_*>_> functions;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  undefined1 local_40 [8];
  string svc_name;
  t_service *tservice_local;
  ostream *out_local;
  t_d_generator *this_local;
  
  svc_name.field_2._8_8_ = tservice;
  iVar2 = (*(tservice->super_t_type).super_t_doc._vptr_t_doc[3])();
  suffix_if_reserved((string *)local_40,(string *)CONCAT44(extraout_var,iVar2));
  poVar4 = std::operator<<(out,"/*");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  poVar4 = std::operator<<(poVar4,
                           " * This auto-generated skeleton file illustrates how to build a server. If you"
                          );
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  poVar4 = std::operator<<(poVar4,
                           " * intend to customize it, you should edit a copy with another file name to "
                          );
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  poVar4 = std::operator<<(poVar4," * avoid overwriting it when running the generator again.");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  poVar4 = std::operator<<(poVar4," */");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  poVar4 = std::operator<<(poVar4,"module ");
  ptVar5 = t_type::get_program((t_type *)svc_name.field_2._8_8_);
  render_package_abi_cxx11_(&local_70,this,ptVar5);
  poVar4 = std::operator<<(poVar4,(string *)&local_70);
  poVar4 = std::operator<<(poVar4,(string *)local_40);
  poVar4 = std::operator<<(poVar4,"_server;");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  poVar4 = std::operator<<(poVar4,"import std.stdio;");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  poVar4 = std::operator<<(poVar4,"import thrift.codegen.processor;");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  poVar4 = std::operator<<(poVar4,"import thrift.protocol.binary;");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  poVar4 = std::operator<<(poVar4,"import thrift.server.simple;");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  poVar4 = std::operator<<(poVar4,"import thrift.server.transport.socket;");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  poVar4 = std::operator<<(poVar4,"import thrift.transport.buffered;");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  poVar4 = std::operator<<(poVar4,"import thrift.util.hashset;");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  poVar4 = std::operator<<(poVar4,"import ");
  ptVar5 = t_type::get_program((t_type *)svc_name.field_2._8_8_);
  render_package_abi_cxx11_(&local_90,this,ptVar5);
  poVar4 = std::operator<<(poVar4,(string *)&local_90);
  poVar4 = std::operator<<(poVar4,(string *)local_40);
  poVar4 = std::operator<<(poVar4,";");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  poVar4 = std::operator<<(poVar4,"import ");
  ptVar5 = t_generator::get_program((t_generator *)this);
  render_package_abi_cxx11_(&local_b0,this,ptVar5);
  poVar4 = std::operator<<(poVar4,(string *)&local_b0);
  poVar4 = std::operator<<(poVar4,(string *)
                                  &(this->super_t_oop_generator).super_t_generator.program_name_);
  poVar4 = std::operator<<(poVar4,"_types;");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  poVar4 = std::operator<<(poVar4,"class ");
  poVar4 = std::operator<<(poVar4,(string *)local_40);
  poVar4 = std::operator<<(poVar4,"Handler : ");
  poVar4 = std::operator<<(poVar4,(string *)local_40);
  poVar4 = std::operator<<(poVar4," {");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_70);
  t_generator::indent_up((t_generator *)this);
  t_generator::indent_abi_cxx11_(&local_d0,(t_generator *)this);
  poVar4 = std::operator<<(out,(string *)&local_d0);
  poVar4 = std::operator<<(poVar4,"this() {");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_f0,(t_generator *)this);
  poVar4 = std::operator<<(poVar4,(string *)&local_f0);
  poVar4 = std::operator<<(poVar4,"  // Your initialization goes here.");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_
            ((string *)
             &functions.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(t_generator *)this);
  poVar4 = std::operator<<(poVar4,(string *)
                                  &functions.
                                   super__Vector_base<t_function_*,_std::allocator<t_function_*>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage);
  poVar4 = std::operator<<(poVar4,"}");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string
            ((string *)
             &functions.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_d0);
  __x = t_service::get_functions((t_service *)svc_name.field_2._8_8_);
  std::vector<t_function_*,_std::allocator<t_function_*>_>::vector
            ((vector<t_function_*,_std::allocator<t_function_*>_> *)&f_iter,__x);
  __gnu_cxx::
  __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>::
  __normal_iterator(&local_130);
  local_138 = (t_function **)
              std::vector<t_function_*,_std::allocator<t_function_*>_>::begin
                        ((vector<t_function_*,_std::allocator<t_function_*>_> *)&f_iter);
  local_130._M_current = local_138;
  while( true ) {
    local_140._M_current =
         (t_function **)
         std::vector<t_function_*,_std::allocator<t_function_*>_>::end
                   ((vector<t_function_*,_std::allocator<t_function_*>_> *)&f_iter);
    bVar1 = __gnu_cxx::operator!=(&local_130,&local_140);
    if (!bVar1) break;
    t_generator::indent_abi_cxx11_(&local_160,(t_generator *)this);
    std::operator<<(out,(string *)&local_160);
    std::__cxx11::string::~string((string *)&local_160);
    pptVar6 = __gnu_cxx::
              __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
              ::operator*(&local_130);
    print_function_signature(this,out,*pptVar6);
    poVar4 = std::operator<<(out," {");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    t_generator::indent_up((t_generator *)this);
    t_generator::indent_abi_cxx11_(&local_180,(t_generator *)this);
    poVar4 = std::operator<<(out,(string *)&local_180);
    poVar4 = std::operator<<(poVar4,"// Your implementation goes here.");
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_1a0,(t_generator *)this);
    poVar4 = std::operator<<(poVar4,(string *)&local_1a0);
    poVar4 = std::operator<<(poVar4,"writeln(\"");
    pptVar6 = __gnu_cxx::
              __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
              ::operator*(&local_130);
    name = t_function::get_name_abi_cxx11_(*pptVar6);
    suffix_if_reserved((string *)&rt,name);
    poVar4 = std::operator<<(poVar4,(string *)&rt);
    poVar4 = std::operator<<(poVar4," called\");");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&rt);
    std::__cxx11::string::~string((string *)&local_1a0);
    std::__cxx11::string::~string((string *)&local_180);
    pptVar6 = __gnu_cxx::
              __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
              ::operator*(&local_130);
    local_1c8 = t_function::get_returntype(*pptVar6);
    uVar3 = (*(local_1c8->super_t_doc)._vptr_t_doc[4])();
    if ((uVar3 & 1) == 0) {
      poVar4 = t_generator::indent((t_generator *)this,out);
      poVar4 = std::operator<<(poVar4,"return typeof(return).init;");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    }
    t_generator::indent_down((t_generator *)this);
    t_generator::indent_abi_cxx11_(&local_1e8,(t_generator *)this);
    poVar4 = std::operator<<(out,(string *)&local_1e8);
    poVar4 = std::operator<<(poVar4,"}");
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_1e8);
    __gnu_cxx::
    __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>::
    operator++(&local_130);
  }
  t_generator::indent_down((t_generator *)this);
  poVar4 = std::operator<<(out,"}");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_208,(t_generator *)this);
  poVar4 = std::operator<<(out,(string *)&local_208);
  poVar4 = std::operator<<(poVar4,"void main() {");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_208);
  t_generator::indent_up((t_generator *)this);
  t_generator::indent_abi_cxx11_(&local_228,(t_generator *)this);
  poVar4 = std::operator<<(out,(string *)&local_228);
  poVar4 = std::operator<<(poVar4,"auto protocolFactory = new TBinaryProtocolFactory!();");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_248,(t_generator *)this);
  poVar4 = std::operator<<(poVar4,(string *)&local_248);
  poVar4 = std::operator<<(poVar4,"auto processor = new TServiceProcessor!");
  poVar4 = std::operator<<(poVar4,(string *)local_40);
  poVar4 = std::operator<<(poVar4,"(new ");
  poVar4 = std::operator<<(poVar4,(string *)local_40);
  poVar4 = std::operator<<(poVar4,"Handler);");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_268,(t_generator *)this);
  poVar4 = std::operator<<(poVar4,(string *)&local_268);
  poVar4 = std::operator<<(poVar4,"auto serverTransport = new TServerSocket(9090);");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_288,(t_generator *)this);
  poVar4 = std::operator<<(poVar4,(string *)&local_288);
  poVar4 = std::operator<<(poVar4,"auto transportFactory = new TBufferedTransportFactory;");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_2a8,(t_generator *)this);
  poVar4 = std::operator<<(poVar4,(string *)&local_2a8);
  poVar4 = std::operator<<(poVar4,"auto server = new TSimpleServer(");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_2c8,(t_generator *)this);
  poVar4 = std::operator<<(poVar4,(string *)&local_2c8);
  poVar4 = std::operator<<(poVar4,
                           "  processor, serverTransport, transportFactory, protocolFactory);");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_2e8,(t_generator *)this);
  poVar4 = std::operator<<(poVar4,(string *)&local_2e8);
  poVar4 = std::operator<<(poVar4,"server.serve();");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_2e8);
  std::__cxx11::string::~string((string *)&local_2c8);
  std::__cxx11::string::~string((string *)&local_2a8);
  std::__cxx11::string::~string((string *)&local_288);
  std::__cxx11::string::~string((string *)&local_268);
  std::__cxx11::string::~string((string *)&local_248);
  std::__cxx11::string::~string((string *)&local_228);
  t_generator::indent_down((t_generator *)this);
  poVar4 = std::operator<<(out,"}");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::vector<t_function_*,_std::allocator<t_function_*>_>::~vector
            ((vector<t_function_*,_std::allocator<t_function_*>_> *)&f_iter);
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

void print_server_skeleton(ostream& out, t_service* tservice) {
    string svc_name = suffix_if_reserved(tservice->get_name());

    out << "/*" << endl
        << " * This auto-generated skeleton file illustrates how to build a server. If you" << endl
        << " * intend to customize it, you should edit a copy with another file name to " << endl
        << " * avoid overwriting it when running the generator again." << endl << " */" << endl
        << "module " << render_package(*tservice->get_program()) << svc_name << "_server;" << endl
        << endl << "import std.stdio;" << endl << "import thrift.codegen.processor;" << endl
        << "import thrift.protocol.binary;" << endl << "import thrift.server.simple;" << endl
        << "import thrift.server.transport.socket;" << endl << "import thrift.transport.buffered;"
        << endl << "import thrift.util.hashset;" << endl << endl << "import "
        << render_package(*tservice->get_program()) << svc_name << ";" << endl << "import "
        << render_package(*get_program()) << program_name_ << "_types;" << endl << endl << endl
        << "class " << svc_name << "Handler : " << svc_name << " {" << endl;

    indent_up();
    out << indent() << "this() {" << endl << indent() << "  // Your initialization goes here."
        << endl << indent() << "}" << endl << endl;

    vector<t_function*> functions = tservice->get_functions();
    vector<t_function*>::iterator f_iter;
    for (f_iter = functions.begin(); f_iter != functions.end(); ++f_iter) {
      out << indent();
      print_function_signature(out, *f_iter);
      out << " {" << endl;

      indent_up();

      out << indent() << "// Your implementation goes here." << endl << indent() << "writeln(\""
          << suffix_if_reserved((*f_iter)->get_name()) << " called\");" << endl;

	  t_type* rt = (*f_iter)->get_returntype();
	  if (!rt->is_void()) {
        indent(out) << "return typeof(return).init;" << endl;
      }

      indent_down();

      out << indent() << "}" << endl << endl;
    }

    indent_down();
    out << "}" << endl << endl;

    out << indent() << "void main() {" << endl;
    indent_up();
    out << indent() << "auto protocolFactory = new TBinaryProtocolFactory!();" << endl << indent()
        << "auto processor = new TServiceProcessor!" << svc_name << "(new " << svc_name
        << "Handler);" << endl << indent() << "auto serverTransport = new TServerSocket(9090);"
        << endl << indent() << "auto transportFactory = new TBufferedTransportFactory;" << endl
        << indent() << "auto server = new TSimpleServer(" << endl << indent()
        << "  processor, serverTransport, transportFactory, protocolFactory);" << endl << indent()
        << "server.serve();" << endl;
    indent_down();
    out << "}" << endl;
  }